

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DiskROM.cpp
# Opt level: O2

ssize_t __thiscall MSX::DiskROM::read(DiskROM *this,int __fd,void *__buf,size_t __nbytes)

{
  pointer puVar1;
  ssize_t sVar2;
  
  if ((short)(__fd & 0xfffffffcU) == 0x7ff8) {
    sVar2 = WD::WD1770::read(&this->super_WD1770,__fd,__buf,__nbytes);
    return sVar2;
  }
  if ((short)__fd == 0x7fff) {
    return (ulong)CONCAT31((int3)((__fd & 0xfffffffcU) >> 8),
                           ((this->super_WD1770).status_.interrupt_request ^ 1U) << 6 |
                           ((this->super_WD1770).status_.data_request == false) << 7);
  }
  puVar1 = (this->rom_->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
           super__Vector_impl_data._M_start;
  return CONCAT71((int7)((ulong)puVar1 >> 8),puVar1[__fd & 0x3fff]);
}

Assistant:

uint8_t DiskROM::read(uint16_t address) {
	if(address >= 0x7ff8 && address < 0x7ffc) {
		return WD::WD1770::read(address);
	}
	if(address == 0x7fff) {
		return (get_data_request_line() ? 0x00 : 0x80) | (get_interrupt_request_line() ? 0x00 : 0x40);
	}
	return rom_[address & 0x3fff];
}